

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSwitch(TranslateToFuzzReader *this,Type type)

{
  int iVar1;
  string_view default_;
  value_type *ppEVar2;
  uintptr_t uVar3;
  Switch *pSVar4;
  Expression *pEVar5;
  Expression *value;
  TranslateToFuzzReader *this_00;
  uint uVar6;
  Type TVar7;
  bool bVar8;
  undefined1 auStack_58 [8];
  Name name;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x10eb,"Expression *wasm::TranslateToFuzzReader::makeSwitch(Type)");
  }
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar1 = (this->fuzzParams->super_FuzzParams).TRIES;
    name.super_IString.str._M_str = (char *)0x0;
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (iVar1 < 1) {
      TVar7.id = 1;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      uVar6 = iVar1 + 1;
      TVar7.id = 1;
      do {
        this_00 = (TranslateToFuzzReader *)&this->random;
        ppEVar2 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (&this->random,&this->funcContext->breakableStack);
        pEVar5 = *ppEVar2;
        _auStack_58 = (string_view)getTargetName(this_00,pEVar5);
        if (pEVar5->_id == LoopId) {
          uVar3 = 0;
        }
        else {
          if (pEVar5->_id != BlockId) {
            wasm::handle_unreachable
                      ("unexpected expr type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                       ,0x15f4);
          }
          uVar3 = (pEVar5->type).id;
        }
        if (((pointer)name.super_IString.str._M_str ==
             names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start) ||
           (bVar8 = TVar7.id == uVar3, uVar3 = TVar7.id, bVar8)) {
          TVar7.id = uVar3;
          if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                      ((vector<wasm::Name,std::allocator<wasm::Name>> *)
                       &name.super_IString.str._M_str,(iterator)0x0,(Name *)auStack_58);
          }
          else {
            ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start)->super_IString).str._M_len = (size_t)auStack_58;
            ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start)->super_IString).str._M_str =
                 (char *)name.super_IString.str._M_len;
            names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start =
                 names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
    }
    if ((ulong)((long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)name.super_IString.str._M_str) < 0x11
       ) {
      pSVar4 = (Switch *)make(this,(Type)0x1);
    }
    else {
      default_ = names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start[-1].super_IString.str;
      pEVar5 = make(this,(Type)0x2);
      if (TVar7.id < 2) {
        value = (Expression *)0x0;
      }
      else {
        value = make(this,TVar7);
      }
      pSVar4 = Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         (&this->builder,
                          (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                          &name.super_IString.str._M_str,(Name)default_,pEVar5,value);
    }
    if (name.super_IString.str._M_str != (char *)0x0) {
      operator_delete(name.super_IString.str._M_str,-(long)name.super_IString.str._M_str);
    }
    return (Expression *)pSVar4;
  }
  pEVar5 = make(this,(Type)0x1);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeSwitch(Type type) {
  assert(type == Type::unreachable);
  if (funcContext->breakableStack.empty()) {
    return make(type);
  }
  // we need to find proper targets to break to; try a bunch
  int tries = fuzzParams->TRIES;
  std::vector<Name> names;
  Type valueType = Type::unreachable;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto currValueType = getTargetType(target);
    if (names.empty()) {
      valueType = currValueType;
    } else {
      if (valueType != currValueType) {
        continue; // all values must be the same
      }
    }
    names.push_back(name);
  }
  if (names.size() < 2) {
    // we failed to find enough
    return make(type);
  }
  auto default_ = names.back();
  names.pop_back();
  auto temp1 = make(Type::i32),
       temp2 = valueType.isConcrete() ? make(valueType) : nullptr;
  return builder.makeSwitch(names, default_, temp1, temp2);
}